

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O3

void lore_append_friends(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  _Bool _Var1;
  monster_sex_t mVar2;
  
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) && (lore != (monster_lore *)0x0))
  {
    mVar2 = lore_monster_sex(race);
    if ((race->friends == (monster_friends *)0x0) &&
       (race->friends_base == (monster_friends_base *)0x0)) {
      return;
    }
    textblock_append(tb,"%s may appear with other monsters",
                     *(undefined8 *)
                      (lore_pronoun_nominative_lore_pronouns + (ulong)mVar2 * 0x10 + 8));
    _Var1 = flag_has_dbg(known_flags,0xb,5,"known_flags","RF_GROUP_AI");
    if (_Var1) {
      textblock_append(tb," and hunts in packs");
    }
    textblock_append(tb,".  ");
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/mon-lore.c"
                ,0x5b8,
                "void lore_append_friends(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_friends(textblock *tb, const struct monster_race *race,
						 const struct monster_lore *lore,
						 bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Describe friends */
	if (race->friends || race->friends_base) {
		textblock_append(tb, "%s may appear with other monsters",
						 lore_pronoun_nominative(msex, true));
		if (rf_has(known_flags, RF_GROUP_AI))
			textblock_append(tb, " and hunts in packs");
		textblock_append(tb, ".  ");
	}
}